

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectGlow.cpp
# Opt level: O0

bool __thiscall
Rml::FontEffectGlow::GetGlyphMetrics
          (FontEffectGlow *this,Vector2i *origin,Vector2i *dimensions,FontGlyph *param_3)

{
  bool bVar1;
  FontGlyph *param_3_local;
  Vector2i *dimensions_local;
  Vector2i *origin_local;
  FontEffectGlow *this_local;
  
  bVar1 = 0 < dimensions->x * dimensions->y;
  if (bVar1) {
    origin->x = ((this->offset).x - this->combined_width) + origin->x;
    origin->y = ((this->offset).y - this->combined_width) + origin->y;
    dimensions->x = this->combined_width * 2 + dimensions->x;
    dimensions->y = this->combined_width * 2 + dimensions->y;
  }
  return bVar1;
}

Assistant:

bool FontEffectGlow::GetGlyphMetrics(Vector2i& origin, Vector2i& dimensions, const FontGlyph& /*glyph*/) const
{
	if (dimensions.x * dimensions.y > 0)
	{
		origin.x += offset.x - combined_width;
		origin.y += offset.y - combined_width;

		dimensions.x += 2 * combined_width;
		dimensions.y += 2 * combined_width;

		return true;
	}

	return false;
}